

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_encode_tiles_mt(AV1_COMP *cpi)

{
  int iVar1;
  int num_workers;
  
  iVar1 = (cpi->mt_info).num_mod_workers[4];
  if (cpi->allocated_tiles < (cpi->common).tiles.rows * (cpi->common).tiles.cols) {
    av1_alloc_tile_data(cpi);
  }
  av1_init_tile_data(cpi);
  num_workers = (cpi->mt_info).num_workers;
  if (iVar1 < num_workers) {
    num_workers = iVar1;
  }
  prepare_enc_workers(cpi,enc_worker_hook,num_workers);
  launch_workers(&cpi->mt_info,num_workers);
  sync_enc_workers(&cpi->mt_info,&cpi->common,num_workers);
  accumulate_counters_enc_workers(cpi,num_workers);
  return;
}

Assistant:

void av1_encode_tiles_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int num_workers = mt_info->num_mod_workers[MOD_ENC];

  assert(IMPLIES(cpi->tile_data == NULL,
                 cpi->allocated_tiles < tile_cols * tile_rows));
  if (cpi->allocated_tiles < tile_cols * tile_rows) av1_alloc_tile_data(cpi);

  av1_init_tile_data(cpi);
  num_workers = AOMMIN(num_workers, mt_info->num_workers);

  prepare_enc_workers(cpi, enc_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  accumulate_counters_enc_workers(cpi, num_workers);
}